

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O2

bool __thiscall helics::FederateInfo::checkFlagProperty(FederateInfo *this,int propId,bool defVal)

{
  pair<int,_bool> *prop;
  pointer ppVar1;
  
  ppVar1 = (this->super_CoreFederateInfo).flagProps.
           super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (ppVar1 == (this->super_CoreFederateInfo).flagProps.
                  super__Vector_base<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
LAB_00231006:
      return (bool)(defVal & 1);
    }
    if (ppVar1->first == propId) {
      defVal = ppVar1->second;
      goto LAB_00231006;
    }
    ppVar1 = ppVar1 + 1;
  } while( true );
}

Assistant:

bool FederateInfo::checkFlagProperty(int propId, bool defVal) const
{
    for (const auto& prop : flagProps) {
        if (prop.first == propId) {
            return prop.second;
        }
    }
    return defVal;
}